

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

char * settype(parset s)

{
  if ((uint)s < 0x25) {
    return &DAT_002d7b74 + *(int *)(&DAT_002d7b74 + (ulong)(uint)s * 4);
  }
  vrna_message_error("\nThe answer is: 42\n");
  return "";
}

Assistant:

PUBLIC char *
settype(enum parset s)
{
  switch (s) {
    case        S:
      return "stack";
    case      S_H:
      return "stack_enthalpies";
    case       HP:
      return "hairpin";
    case     HP_H:
      return "hairpin_enthalpies";
    case        B:
      return "bulge";
    case      B_H:
      return "bulge_enthalpies";
    case       IL:
      return "interior";
    case     IL_H:
      return "interior_enthalpies";
    case      MME:
      return "mismatch_exterior";
    case    MME_H:
      return "mismatch_exterior_enthalpies";
    case      MMH:
      return "mismatch_hairpin";
    case    MMH_H:
      return "mismatch_hairpin_enthalpies";
    case      MMI:
      return "mismatch_interior";
    case    MMI_H:
      return "mismatch_interior_enthalpies";
    case    MMI1N:
      return "mismatch_interior_1n";
    case  MMI1N_H:
      return "mismatch_interior_1n_enthalpies";
    case    MMI23:
      return "mismatch_interior_23";
    case  MMI23_H:
      return "mismatch_interior_23_enthalpies";
    case      MMM:
      return "mismatch_multi";
    case    MMM_H:
      return "mismatch_multi_enthalpies";
    case       D5:
      return "dangle5";
    case     D5_H:
      return "dangle5_enthalpies";
    case       D3:
      return "dangle3";
    case     D3_H:
      return "dangle3_enthalpies";
    case    INT11:
      return "int11";
    case  INT11_H:
      return "int11_enthalpies";
    case    INT21:
      return "int21";
    case  INT21_H:
      return "int21_enthalpies";
    case    INT22:
      return "int22";
    case  INT22_H:
      return "int22_enthalpies";
    case       ML:
      return "ML_params";
    case      NIN:
      return "NINIO";
    case      TRI:
      return "Triloops";
    case       TL:
      return "Tetraloops";
    case      HEX:
      return "Hexaloops";
    case     QUIT:
      return "END";
    case     MISC:
      return "Misc";
    default:
      vrna_message_error("\nThe answer is: 42\n");
  }
  return "";
}